

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_sse.c
# Opt level: O2

parasail_profile_t *
parasail_profile_create_stats_sse_128_32(char *s1,int _s1Len,parasail_matrix_t *matrix)

{
  int iVar1;
  int iVar2;
  __m128i *palVar3;
  __m128i *palVar4;
  __m128i *palVar5;
  parasail_profile_t *ppVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  int *piVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  size_t size;
  ulong uVar20;
  long lVar21;
  __m128i_32_t s;
  __m128i_32_t m;
  __m128i_32_t p;
  
  if (matrix == (parasail_matrix_t *)0x0) {
    pcVar8 = "matrix";
  }
  else {
    if (s1 != (char *)0x0) {
      if (matrix->type != 0) {
        _s1Len = matrix->length;
      }
      uVar13 = matrix->size;
      lVar11 = (long)(int)uVar13;
      uVar20 = (long)(_s1Len + 3) / 4;
      iVar2 = (int)uVar20;
      size = iVar2 * lVar11;
      palVar3 = parasail_memalign___m128i(0x10,size);
      if (((palVar3 != (__m128i *)0x0) &&
          (palVar4 = parasail_memalign___m128i(0x10,size), palVar4 != (__m128i *)0x0)) &&
         (palVar5 = parasail_memalign___m128i(0x10,size), palVar5 != (__m128i *)0x0)) {
        ppVar6 = parasail_profile_new(s1,_s1Len,matrix);
        uVar15 = 0;
        if (ppVar6 != (parasail_profile_t *)0x0) {
          uVar20 = uVar20 & 0xffffffff;
          if (iVar2 < 1) {
            uVar20 = uVar15;
          }
          uVar7 = 0;
          if (0 < (int)uVar13) {
            uVar7 = (ulong)uVar13;
          }
          lVar9 = (long)_s1Len;
          lVar14 = 0;
          do {
            if (uVar15 == uVar7) {
              (ppVar6->profile32).score = palVar3;
              (ppVar6->profile32).matches = palVar4;
              (ppVar6->profile32).similar = palVar5;
              ppVar6->free = parasail_free___m128i;
              return ppVar6;
            }
            lVar14 = (long)(int)lVar14;
            lVar17 = 0;
            for (uVar19 = 0; uVar19 != uVar20; uVar19 = uVar19 + 1) {
              iVar1 = matrix->type;
              lVar16 = lVar17;
              uVar18 = uVar19;
              for (lVar21 = 0; lVar21 != 4; lVar21 = lVar21 + 1) {
                if (iVar1 == 0) {
                  if ((long)uVar18 < lVar9) {
                    piVar12 = matrix->matrix +
                              uVar15 * lVar11 + (long)matrix->mapper[(byte)s1[uVar18]];
                    goto LAB_0054bf6a;
                  }
LAB_0054bf6e:
                  iVar10 = 0;
                }
                else {
                  if (lVar9 <= (long)uVar18) goto LAB_0054bf6e;
                  piVar12 = (int *)((long)matrix->matrix +
                                   lVar16 + (long)matrix->mapper[(byte)matrix->alphabet[uVar15]] * 4
                                   );
LAB_0054bf6a:
                  iVar10 = *piVar12;
                }
                *(int *)((long)&p + lVar21 * 4) = iVar10;
                uVar13 = 0;
                if ((long)uVar18 < lVar9) {
                  uVar13 = (uint)(uVar15 == (uint)matrix->mapper[(byte)s1[uVar18]]);
                }
                *(uint *)((long)&m + lVar21 * 4) = uVar13;
                *(uint *)((long)&s + lVar21 * 4) = (uint)(0 < iVar10);
                uVar18 = uVar18 + (long)iVar2;
                lVar16 = lVar16 + size * 4;
              }
              palVar3[lVar14][0] = p.m[0];
              palVar3[lVar14][1] = p.m[1];
              palVar4[lVar14][0] = m.m[0];
              palVar4[lVar14][1] = m.m[1];
              palVar5[lVar14][0] = s.m[0];
              palVar5[lVar14][1] = s.m[1];
              lVar14 = lVar14 + 1;
              lVar17 = lVar17 + lVar11 * 4;
            }
            uVar15 = uVar15 + 1;
          } while( true );
        }
      }
      return (parasail_profile_t *)0x0;
    }
    pcVar8 = "s1";
  }
  fprintf(_stderr,"%s: missing %s\n","parasail_profile_create_stats_sse_128_32",pcVar8);
  return (parasail_profile_t *)0x0;
}

Assistant:

parasail_profile_t * parasail_profile_create_stats_sse_128_32(
        const char * const restrict s1, const int _s1Len,
        const parasail_matrix_t *matrix)
{
    int s1Len = 0;
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    int32_t n = 0;
    const int32_t segWidth = 4; /* number of values in vector unit */
    int32_t segLen = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    int32_t index = 0;
    parasail_profile_t *profile = NULL;

    PARASAIL_CHECK_NULL(matrix);
    /* s1 is required for both pssm and square */
    PARASAIL_CHECK_NULL(s1);

    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    n = matrix->size; /* number of amino acids in table */
    segLen = (s1Len + segWidth - 1) / segWidth;
    vProfile = parasail_memalign___m128i(16, n * segLen);
    if (!vProfile) return NULL;
    vProfileM = parasail_memalign___m128i(16, n * segLen);
    if (!vProfileM) return NULL;
    vProfileS = parasail_memalign___m128i(16, n * segLen);
    if (!vProfileS) return NULL;
    profile = parasail_profile_new(s1, s1Len, matrix);
    if (!profile) return NULL;

    for (k=0; k<n; ++k) {
        for (i=0; i<segLen; ++i) {
            __m128i_32_t p;
            __m128i_32_t m;
            __m128i_32_t s;
            j = i;
            for (segNum=0; segNum<segWidth; ++segNum) {
                if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
                    p.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*k+matrix->mapper[(unsigned char)s1[j]]];
                }
                else {
                    p.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*j+matrix->mapper[(unsigned char)matrix->alphabet[k]]];
                }
                m.v[segNum] = j >= s1Len ? 0 : (k == matrix->mapper[(unsigned char)s1[j]]);
                s.v[segNum] = p.v[segNum] > 0;
                j += segLen;
            }
            _mm_store_si128(&vProfile[index], p.m);
            _mm_store_si128(&vProfileM[index], m.m);
            _mm_store_si128(&vProfileS[index], s.m);
            ++index;
        }
    }

    profile->profile32.score = vProfile;
    profile->profile32.matches = vProfileM;
    profile->profile32.similar = vProfileS;
    profile->free = &parasail_free___m128i;
    return profile;
}